

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerResults.cpp
# Opt level: O2

void __thiscall
MDIOAnalyzerResults::GenerateExportFile
          (MDIOAnalyzerResults *this,char *file,DisplayBase display_base,U32 param_3)

{
  undefined2 uVar1;
  U64 UVar2;
  undefined8 uVar3;
  undefined2 uVar4;
  char cVar5;
  uint uVar6;
  ulonglong uVar7;
  ostream *poVar8;
  ulonglong *puVar9;
  uint uVar10;
  ulonglong *puVar11;
  char *pcVar12;
  Frame frame;
  undefined1 uStack_487;
  undefined1 uStack_486;
  undefined1 uStack_485;
  undefined1 uStack_484;
  undefined1 uStack_483;
  undefined1 uStack_482;
  undefined1 uStack_481;
  char local_468 [8];
  U64 last_frame_id;
  U64 first_frame_id;
  char number_str2 [128];
  char number_str [128];
  char number_str_1 [128];
  char time_str [128];
  ofstream file_stream;
  
  std::ofstream::ofstream(&file_stream,file,_S_out);
  uVar7 = Analyzer::GetTriggerSample();
  uVar6 = Analyzer::GetSampleRate();
  poVar8 = std::operator<<((ostream *)&file_stream,
                           "Time [s],Packet ID,MDIOClause,OP,PHYADDR,REGADDR/DEVTYPE,ADDR/DATA");
  std::endl<char,std::char_traits<char>>(poVar8);
  puVar9 = (ulonglong *)AnalyzerResults::GetNumPackets();
  uVar10 = 0;
  do {
    puVar11 = (ulonglong *)(ulong)uVar10;
    if (puVar9 <= puVar11) {
      AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,(ulonglong)puVar9);
LAB_00107673:
      std::ofstream::~ofstream(&file_stream);
      return;
    }
    AnalyzerResults::GetFramesContainedInPacket((ulonglong)this,puVar11,&first_frame_id);
    UVar2 = first_frame_id;
    AnalyzerResults::GetFrame((ulonglong)&frame);
    AnalyzerHelpers::GetTimeString(_frame,uVar7,uVar6,time_str,0x80);
    poVar8 = std::operator<<((ostream *)&file_stream,time_str);
    poVar8 = std::operator<<(poVar8,",");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::operator<<(poVar8,",");
    pcVar12 = ",";
    if (local_468[0] == '\x01') {
      pcVar12 = "45,";
    }
    if (local_468[0] == '\0') {
      pcVar12 = "22,";
    }
    std::operator<<((ostream *)&file_stream,pcVar12);
    if (UVar2 + 1 <= last_frame_id) {
      AnalyzerResults::GetFrame((ulonglong)number_str);
      uVar4 = number_str._32_2_;
      local_468[0] = number_str[0x20];
      local_468[1] = number_str[0x21];
      uVar1 = local_468._0_2_;
      frame = (Frame)number_str[0];
      uStack_487 = number_str[1];
      uStack_486 = number_str[2];
      uStack_485 = number_str[3];
      uStack_484 = number_str[4];
      uStack_483 = number_str[5];
      uStack_482 = number_str[6];
      uStack_481 = number_str[7];
      Frame::~Frame((Frame *)number_str);
      local_468[0] = (char)uVar4;
      pcVar12 = ",";
      if ((byte)(local_468[0] - 2U) < 4) {
        pcVar12 = &DAT_0010916c + *(int *)(&DAT_0010916c + (ulong)(byte)(local_468[0] - 2U) * 4);
      }
      std::operator<<((ostream *)&file_stream,pcVar12);
      local_468._0_2_ = uVar1;
      if (UVar2 + 2 <= last_frame_id) {
        AnalyzerResults::GetFrame((ulonglong)number_str);
        uVar4 = number_str._32_2_;
        uVar3 = number_str._16_8_;
        local_468[0] = number_str[0x20];
        local_468[1] = number_str[0x21];
        uVar1 = local_468._0_2_;
        frame = (Frame)number_str[0];
        uStack_487 = number_str[1];
        uStack_486 = number_str[2];
        uStack_485 = number_str[3];
        uStack_484 = number_str[4];
        uStack_483 = number_str[5];
        uStack_482 = number_str[6];
        uStack_481 = number_str[7];
        Frame::~Frame((Frame *)number_str);
        local_468[0] = (char)uVar4;
        if (local_468[0] != '\x06') {
          std::operator<<((ostream *)&file_stream,",");
        }
        AnalyzerHelpers::GetNumberString(uVar3,display_base,5,number_str,0x80);
        poVar8 = std::operator<<((ostream *)&file_stream,number_str);
        std::operator<<(poVar8,",");
        local_468._0_2_ = uVar1;
        if (UVar2 + 3 <= last_frame_id) {
          AnalyzerResults::GetFrame((ulonglong)number_str2);
          uVar4 = number_str2._32_2_;
          uVar3 = number_str2._16_8_;
          local_468[0] = number_str2[0x20];
          local_468[1] = number_str2[0x21];
          uVar1 = local_468._0_2_;
          frame = (Frame)number_str2[0];
          uStack_487 = number_str2[1];
          uStack_486 = number_str2[2];
          uStack_485 = number_str2[3];
          uStack_484 = number_str2[4];
          uStack_483 = number_str2[5];
          uStack_482 = number_str2[6];
          uStack_481 = number_str2[7];
          Frame::~Frame((Frame *)number_str2);
          AnalyzerHelpers::GetNumberString(uVar3,display_base,5,number_str2,0x80);
          local_468[0] = (char)uVar4;
          pcVar12 = ",";
          poVar8 = (ostream *)&file_stream;
          switch(local_468[0]) {
          case '\a':
            poVar8 = std::operator<<((ostream *)&file_stream,number_str2);
            pcVar12 = ",";
            break;
          case '\b':
            poVar8 = std::operator<<((ostream *)&file_stream,number_str2);
            pcVar12 = "(Reserved),";
            break;
          case '\t':
            poVar8 = std::operator<<((ostream *)&file_stream,number_str2);
            pcVar12 = "(PMD/PMA),";
            break;
          case '\n':
            poVar8 = std::operator<<((ostream *)&file_stream,number_str2);
            pcVar12 = "(WIS),";
            break;
          case '\v':
            poVar8 = std::operator<<((ostream *)&file_stream,number_str2);
            pcVar12 = "(PCS),";
            break;
          case '\f':
            poVar8 = std::operator<<((ostream *)&file_stream,number_str2);
            pcVar12 = "(PHY XS),";
            break;
          case '\r':
            poVar8 = std::operator<<((ostream *)&file_stream,number_str2);
            pcVar12 = "(DTE XS),";
            break;
          case '\x0e':
            poVar8 = std::operator<<((ostream *)&file_stream,number_str2);
            pcVar12 = "(Other),";
          }
          std::operator<<(poVar8,pcVar12);
          local_468._0_2_ = uVar1;
          if (UVar2 + 4 <= last_frame_id) {
            AnalyzerResults::GetFrame((ulonglong)number_str_1);
            uVar4 = number_str_1._32_2_;
            local_468[0] = number_str_1[0x20];
            local_468[1] = number_str_1[0x21];
            uVar1 = local_468._0_2_;
            frame = (Frame)number_str_1[0];
            uStack_487 = number_str_1[1];
            uStack_486 = number_str_1[2];
            uStack_485 = number_str_1[3];
            uStack_484 = number_str_1[4];
            uStack_483 = number_str_1[5];
            uStack_482 = number_str_1[6];
            uStack_481 = number_str_1[7];
            Frame::~Frame((Frame *)number_str_1);
            local_468[0] = (char)uVar4;
            if (local_468[0] != '\x0f') {
              std::operator<<((ostream *)&file_stream,",");
            }
            local_468._0_2_ = uVar1;
            if (UVar2 + 5 <= last_frame_id) {
              AnalyzerResults::GetFrame((ulonglong)number_str_1);
              uVar4 = number_str_1._32_2_;
              uVar3 = number_str_1._16_8_;
              local_468[0] = number_str_1[0x20];
              local_468[1] = number_str_1[0x21];
              uVar1 = local_468._0_2_;
              frame = (Frame)number_str_1[0];
              uStack_487 = number_str_1[1];
              uStack_486 = number_str_1[2];
              uStack_485 = number_str_1[3];
              uStack_484 = number_str_1[4];
              uStack_483 = number_str_1[5];
              uStack_482 = number_str_1[6];
              uStack_481 = number_str_1[7];
              Frame::~Frame((Frame *)number_str_1);
              local_468[0] = (char)uVar4;
              if ((byte)(local_468[0] - 0x10U) < 3) {
                AnalyzerHelpers::GetNumberString(uVar3,display_base,0x10,number_str_1,0x80);
                std::operator<<((ostream *)&file_stream,number_str_1);
              }
              else {
                std::operator<<((ostream *)&file_stream,",");
              }
              std::endl<char,std::char_traits<char>>((ostream *)&file_stream);
              cVar5 = AnalyzerResults::UpdateExportProgressAndCheckForCancel
                                ((ulonglong)this,(ulonglong)puVar11);
              local_468._0_2_ = uVar1;
              if (cVar5 != '\0') {
                Frame::~Frame(&frame);
                goto LAB_00107673;
              }
            }
          }
        }
      }
    }
    Frame::~Frame(&frame);
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void MDIOAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 /*export_type_user_id*/ )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    file_stream << "Time [s],Packet ID,MDIOClause,OP,PHYADDR,REGADDR/DEVTYPE,ADDR/DATA" << std::endl;

    U64 num_packets = GetNumPackets();

    for( U32 packet_id = 0; packet_id < num_packets; ++packet_id )
    {
        // get the frames contained in packet with index packet_id
        U64 first_frame_id;
        U64 last_frame_id;
        GetFramesContainedInPacket( packet_id, &first_frame_id, &last_frame_id );

        U64 frame_id = first_frame_id;

        // get MDIO_START frame to get the MDIOClause column value
        Frame frame = GetFrame( frame_id );

        char time_str[ 128 ];
        AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

        // Time [s] and Packet ID column
        file_stream << time_str << "," << packet_id << ",";

        if( frame.mType == MDIO_C22_START )
        {
            file_stream << "22,";
        }
        else if( frame.mType == MDIO_C45_START )
        {
            file_stream << "45,";
        }
        else
        {
            file_stream << ",";
        }

        ++frame_id;

        if( frame_id > last_frame_id )
        {
            continue;
        }

        // OP frame
        frame = GetFrame( frame_id );

        switch( frame.mType )
        {
        case MDIO_OP_W:
            file_stream << "Write,";
            break;
        case MDIO_OP_R:
            file_stream << "Read,";
            break;
        case MDIO_C45_OP_ADDR:
            file_stream << "Address,";
            break;
        case MDIO_C45_OP_READ_INC_ADDR:
            file_stream << "Read +Addr,";
            break;
        default:
            file_stream << ",";
            break;
        }

        ++frame_id;

        if( frame_id > last_frame_id )
        {
            continue;
        }

        // PHYADDR frame
        frame = GetFrame( frame_id );

        if( frame.mType != MDIO_PHYADDR )
        {
            file_stream << ",";
        }

        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );

        file_stream << number_str << ",";

        ++frame_id;

        if( frame_id > last_frame_id )
        {
            continue;
        }

        // REGADR or DEVTYPE frame
        frame = GetFrame( frame_id );

        char number_str2[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str2, 128 );

        switch( frame.mType )
        {
        case MDIO_C22_REGADDR:
            file_stream << number_str2 << ",";
            break;
        case MDIO_C45_DEVTYPE_RESERVED:
            file_stream << number_str2 << "(Reserved),";
            break;
        case MDIO_C45_DEVTYPE_PMD_PMA:
            file_stream << number_str2 << "(PMD/PMA),";
            break;
        case MDIO_C45_DEVTYPE_WIS:
            file_stream << number_str2 << "(WIS),";
            break;
        case MDIO_C45_DEVTYPE_PCS:
            file_stream << number_str2 << "(PCS),";
            break;
        case MDIO_C45_DEVTYPE_PHY_XS:
            file_stream << number_str2 << "(PHY XS),";
            break;
        case MDIO_C45_DEVTYPE_DTE_XS:
            file_stream << number_str2 << "(DTE XS),";
            break;
        case MDIO_C45_DEVTYPE_OTHER:
            file_stream << number_str2 << "(Other),";
            break;
        default:
            file_stream << ",";
        }

        ++frame_id;
        if( frame_id > last_frame_id )
        {
            continue;
        }

        // TA frame
        frame = GetFrame( frame_id );

        if( frame.mType != MDIO_TA )
        {
            file_stream << ",";
        }

        ++frame_id;
        if( frame_id > last_frame_id )
        {
            continue;
        }

        // MDIO_C22_DATA or MDIO_C45_ADDRDATA frame
        frame = GetFrame( frame_id );

        if( frame.mType == MDIO_C22_DATA || frame.mType == MDIO_C45_ADDR || frame.mType == MDIO_C45_DATA )
        {
            char number_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );
            file_stream << number_str;
        }
        else
        {
            file_stream << ",";
        }

        file_stream << std::endl;

        // check for cancel and update progress
        if( UpdateExportProgressAndCheckForCancel( packet_id, num_packets ) )
        {
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( num_packets, num_packets );
}